

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

void tcu::fillWithComponentGradients(PixelBufferAccess *access,Vec4 *minVal,Vec4 *maxVal)

{
  undefined8 uVar1;
  ChannelOrder CVar2;
  int iVar3;
  ulong uVar4;
  int x;
  int iVar5;
  int y;
  int z;
  int x_1;
  int iVar6;
  float fVar7;
  float fVar17;
  undefined1 in_XMM0 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar13 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar14 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined4 uStack_a4;
  PixelBufferAccess local_98;
  undefined1 local_68 [16];
  Vec4 local_58;
  Vec4 local_48;
  undefined1 auVar11 [16];
  undefined1 auVar15 [16];
  undefined1 auVar12 [16];
  undefined1 auVar16 [16];
  
  uVar4 = (ulong)(access->super_ConstPixelBufferAccess).m_format.type;
  if ((0x25 < uVar4) || ((0x2007000000U >> (uVar4 & 0x3f) & 1) == 0)) {
    iVar5 = (access->super_ConstPixelBufferAccess).m_size.m_data[1];
    iVar6 = (access->super_ConstPixelBufferAccess).m_size.m_data[2];
    if (iVar6 == 1 && iVar5 == 1) {
      for (iVar5 = 0; iVar6 = (access->super_ConstPixelBufferAccess).m_size.m_data[0], iVar5 < iVar6
          ; iVar5 = iVar5 + 1) {
        fVar7 = ((float)iVar5 + 0.5) / (float)iVar6;
        local_98.super_ConstPixelBufferAccess.m_format.order =
             (ChannelOrder)(fVar7 * (maxVal->m_data[0] - minVal->m_data[0]) + minVal->m_data[0]);
        local_98.super_ConstPixelBufferAccess.m_format.type =
             (ChannelType)(fVar7 * (maxVal->m_data[1] - minVal->m_data[1]) + minVal->m_data[1]);
        local_98.super_ConstPixelBufferAccess.m_size.m_data[0] =
             (int)(fVar7 * (maxVal->m_data[2] - minVal->m_data[2]) + minVal->m_data[2]);
        local_98.super_ConstPixelBufferAccess.m_size.m_data[1] =
             (int)(fVar7 * (maxVal->m_data[3] - minVal->m_data[3]) + minVal->m_data[3]);
        PixelBufferAccess::setPixel(access,(Vec4 *)&local_98,iVar5,0,0);
      }
      return;
    }
    z = 0;
    if (iVar6 == 1) {
      for (; z < iVar5; z = z + 1) {
        auVar8._4_12_ = in_XMM0._4_12_;
        auVar8._0_4_ = (float)z + 0.5;
        auVar13 = auVar8;
        for (iVar5 = 0; iVar6 = (access->super_ConstPixelBufferAccess).m_size.m_data[0],
            iVar5 < iVar6; iVar5 = iVar5 + 1) {
          auVar9._4_12_ = auVar13._4_12_;
          auVar9._0_4_ = (float)iVar5 + 0.5;
          uStack_a4 = in_XMM0._4_4_;
          auVar11._12_4_ = auVar13._12_4_;
          auVar11._0_8_ = auVar9._0_8_;
          auVar11._8_4_ = auVar13._4_4_;
          auVar10._8_8_ = auVar11._8_8_;
          auVar10._4_4_ = auVar8._0_4_;
          auVar10._0_4_ = auVar9._0_4_;
          auVar12._0_12_ = auVar10._0_12_;
          auVar12._12_4_ = uStack_a4;
          auVar18._0_4_ = (float)iVar6;
          auVar18._4_4_ = (float)(access->super_ConstPixelBufferAccess).m_size.m_data[1];
          auVar18._8_8_ = 0;
          auVar13 = divps(auVar12,auVar18);
          fVar7 = auVar13._0_4_;
          fVar17 = auVar13._4_4_;
          local_98.super_ConstPixelBufferAccess.m_format.order =
               (ChannelOrder)
               ((maxVal->m_data[0] - minVal->m_data[0]) * (fVar17 + fVar7) * 0.5 + minVal->m_data[0]
               );
          local_98.super_ConstPixelBufferAccess.m_format.type =
               (ChannelType)
               ((maxVal->m_data[1] - minVal->m_data[1]) * ((1.0 - fVar17) + fVar7) * 0.5 +
               minVal->m_data[1]);
          local_98.super_ConstPixelBufferAccess.m_size.m_data[0] =
               (int)((maxVal->m_data[2] - minVal->m_data[2]) * ((1.0 - fVar7) + fVar17) * 0.5 +
                    minVal->m_data[2]);
          local_98.super_ConstPixelBufferAccess.m_size.m_data[1] =
               (int)((maxVal->m_data[3] - minVal->m_data[3]) *
                     ((1.0 - fVar17) + (1.0 - fVar7)) * 0.5 + minVal->m_data[3]);
          PixelBufferAccess::setPixel(access,(Vec4 *)&local_98,iVar5,z,0);
          auVar13 = extraout_XMM0;
        }
        iVar5 = (access->super_ConstPixelBufferAccess).m_size.m_data[1];
        in_XMM0 = auVar13;
      }
      return;
    }
    for (; z < iVar6; z = z + 1) {
      in_XMM0._0_4_ = (float)z + 0.5;
      local_68 = in_XMM0;
      for (iVar6 = 0; iVar6 < iVar5; iVar6 = iVar6 + 1) {
        auVar13._4_12_ = in_XMM0._4_12_;
        auVar13._0_4_ = (float)iVar6 + 0.5;
        auVar15._12_4_ = in_XMM0._12_4_;
        auVar15._0_8_ = auVar13._0_8_;
        auVar15._8_4_ = in_XMM0._4_4_;
        auVar14._8_8_ = auVar15._8_8_;
        auVar14._4_4_ = local_68._0_4_;
        auVar14._0_4_ = auVar13._0_4_;
        auVar16._0_12_ = auVar14._0_12_;
        auVar16._12_4_ = local_68._4_4_;
        in_XMM0 = auVar16;
        for (iVar5 = 0; iVar3 = (access->super_ConstPixelBufferAccess).m_size.m_data[0],
            iVar5 < iVar3; iVar5 = iVar5 + 1) {
          fVar7 = ((float)iVar5 + 0.5) / (float)iVar3;
          uVar1 = *(undefined8 *)((access->super_ConstPixelBufferAccess).m_size.m_data + 1);
          auVar19._0_4_ = (float)(int)uVar1;
          auVar19._4_4_ = (float)(int)((ulong)uVar1 >> 0x20);
          auVar19._8_8_ = 0;
          auVar13 = divps(auVar16,auVar19);
          local_98.super_ConstPixelBufferAccess.m_format.order =
               (ChannelOrder)(fVar7 * (maxVal->m_data[0] - minVal->m_data[0]) + minVal->m_data[0]);
          local_98.super_ConstPixelBufferAccess.m_format.type =
               (ChannelType)
               (auVar13._0_4_ * (maxVal->m_data[1] - minVal->m_data[1]) + minVal->m_data[1]);
          local_98.super_ConstPixelBufferAccess.m_size.m_data[0] =
               (int)(auVar13._4_4_ * (maxVal->m_data[2] - minVal->m_data[2]) + minVal->m_data[2]);
          local_98.super_ConstPixelBufferAccess.m_size.m_data[1] =
               (int)(((auVar13._4_4_ + fVar7 + auVar13._0_4_) / -3.0 + 1.0) *
                     (maxVal->m_data[3] - minVal->m_data[3]) + minVal->m_data[3]);
          PixelBufferAccess::setPixel(access,(Vec4 *)&local_98,iVar5,iVar6,z);
          in_XMM0 = extraout_XMM0_00;
        }
        iVar5 = (access->super_ConstPixelBufferAccess).m_size.m_data[1];
      }
      iVar6 = (access->super_ConstPixelBufferAccess).m_size.m_data[2];
    }
    return;
  }
  CVar2 = (access->super_ConstPixelBufferAccess).m_format.order;
  if (CVar2 == DS) {
    getEffectiveDepthStencilAccess(&local_98,access,MODE_DEPTH);
    fillWithComponentGradients(&local_98,minVal,maxVal);
  }
  else if (CVar2 != S) {
    if (CVar2 != D) {
      return;
    }
    getEffectiveDepthStencilAccess(&local_98,access,MODE_DEPTH);
    goto LAB_001f78be;
  }
  getEffectiveDepthStencilAccess(&local_98,access,MODE_STENCIL);
  local_48.m_data[3] = minVal->m_data[0];
  local_48.m_data[2] = minVal->m_data[1];
  local_48.m_data[1] = minVal->m_data[2];
  local_48.m_data[0] = minVal->m_data[3];
  minVal = &local_48;
  local_58.m_data[3] = maxVal->m_data[0];
  local_58.m_data[2] = maxVal->m_data[1];
  local_58.m_data[1] = maxVal->m_data[2];
  local_58.m_data[0] = maxVal->m_data[3];
  maxVal = &local_58;
LAB_001f78be:
  fillWithComponentGradients(&local_98,minVal,maxVal);
  return;
}

Assistant:

void fillWithComponentGradients (const PixelBufferAccess& access, const Vec4& minVal, const Vec4& maxVal)
{
	if (isCombinedDepthStencilType(access.getFormat().type))
	{
		const bool hasDepth		= access.getFormat().order == tcu::TextureFormat::DS || access.getFormat().order == tcu::TextureFormat::D;
		const bool hasStencil	= access.getFormat().order == tcu::TextureFormat::DS || access.getFormat().order == tcu::TextureFormat::S;

		DE_ASSERT(hasDepth || hasStencil);

		// For combined formats, treat D and S as separate channels
		if (hasDepth)
			fillWithComponentGradients(getEffectiveDepthStencilAccess(access, tcu::Sampler::MODE_DEPTH), minVal, maxVal);
		if (hasStencil)
			fillWithComponentGradients(getEffectiveDepthStencilAccess(access, tcu::Sampler::MODE_STENCIL), minVal.swizzle(3,2,1,0), maxVal.swizzle(3,2,1,0));
	}
	else
	{
		if (access.getHeight() == 1 && access.getDepth() == 1)
			fillWithComponentGradients1D(access, minVal, maxVal);
		else if (access.getDepth() == 1)
			fillWithComponentGradients2D(access, minVal, maxVal);
		else
			fillWithComponentGradients3D(access, minVal, maxVal);
	}
}